

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cc
# Opt level: O1

int __thiscall Options::operator()(Options *this,OptIter *iter,char **optarg)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  undefined4 extraout_var;
  char *pcVar5;
  char *pcVar6;
  
  bVar1 = this->field_0x8;
  if (-1 < (char)bVar1) {
    this->field_0x8 = bVar1 & 0x7e;
  }
  if ((this->nextchar != (char *)0x0) && (*this->nextchar != '\0')) {
LAB_001e8aee:
    iVar4 = parse_opt(this,iter,optarg);
    return iVar4;
  }
  do {
    iVar4 = (*iter->_vptr_OptIter[2])(iter);
    pcVar6 = (char *)CONCAT44(extraout_var,iVar4);
    if (pcVar6 == (char *)0x0) {
      this->listopt = (char *)0x0;
      return 0;
    }
    bVar2 = this->field_0x8;
    if ((bVar2 & 1) != 0) {
LAB_001e8bb0:
      if (-1 < (char)bVar1) {
        return 0;
      }
      *optarg = pcVar6;
      (*iter->_vptr_OptIter[3])(iter);
      return -4;
    }
    iVar4 = strcmp(pcVar6,"--");
    if (iVar4 != 0) {
      if (((bVar2 & 1) != 0) ||
         ((cVar3 = *pcVar6, cVar3 != '-' &&
          ((((cVar3 == '\0' && (pcVar6[1] == '\0')) || ((bVar2 & 8) == 0)) || (cVar3 != '+'))))))
      goto LAB_001e8bb0;
      (*iter->_vptr_OptIter[3])(iter);
      bVar1 = this->field_0x8;
      if ((bVar1 & 0x10) == 0) {
        if ((*pcVar6 == '-') && (pcVar6[1] == '-')) {
          pcVar6 = pcVar6 + 2;
        }
        else {
          if (((bVar1 & 8) == 0) || (*pcVar6 != '+')) goto LAB_001e8bef;
          pcVar6 = pcVar6 + 1;
        }
        this->nextchar = pcVar6;
      }
      else {
LAB_001e8bef:
        if (*pcVar6 != '-') {
          pcVar5 = "";
          if (this->listopt != (char *)0x0) {
            pcVar5 = this->listopt;
          }
          cVar3 = *pcVar5;
          *optarg = pcVar6;
          return (int)pcVar5[cVar3 == '-'];
        }
        this->nextchar = pcVar6 + 1;
        if ((bVar1 & 0x20) == 0) goto LAB_001e8aee;
      }
      iVar4 = parse_longopt(this,iter,optarg);
      return iVar4;
    }
    (*iter->_vptr_OptIter[3])(iter);
    this->field_0x8 = this->field_0x8 | 1;
    this->listopt = (char *)0x0;
    if (-1 < (char)bVar1) {
      return 0;
    }
  } while( true );
}

Assistant:

int
Options::operator()(OptIter & iter, const char * & optarg) {
   int parse_opts_only = isOptsOnly(optctrls);
   if (parse_opts_only)  explicit_end = 0;

      // See if we have an option left over from before ...
   if ((nextchar) && *nextchar) {
      return  parse_opt(iter, optarg);
   }

      // Check for end-of-options ...
   const char * arg = NULLSTR;
   int get_next_arg = 0;
   do {
      arg = iter.curr();
      get_next_arg = 0;
      if (arg == NULL) {
         listopt = NULLSTR;
         return  Options::ENDOPTS;
      } else if ((! explicit_end) && isEndOpts(arg)) {
         iter.next();   // advance past end-of-options arg
         listopt = NULLSTR;
         explicit_end = 1;
         if (parse_opts_only)  return  Options::ENDOPTS;
         get_next_arg = 1;  // make sure we look at the next argument.
      }
   } while (get_next_arg);

      // Do we have a positional arg?
   if ( explicit_end || (! isOption(optctrls, arg)) ) {
      if (parse_opts_only) {
         return  Options::ENDOPTS;
      } else {
         optarg = arg;  // set optarg to the positional argument
         iter.next();   // advance iterator to the next argument
         return  Options::POSITIONAL;
      }
   }

   iter.next();  // pass the argument that arg already points to

      // See if we have a long option ...
   if (! (optctrls & Options::SHORT_ONLY)) {
      if ((*arg == '-') && (arg[1] == '-')) {
         nextchar = arg + 2;
         return  parse_longopt(iter, optarg);
      } else if ((optctrls & Options::PLUS) && (*arg == '+')) {
         nextchar = arg + 1;
         return  parse_longopt(iter, optarg);
      }
   }
   if (*arg == '-') {
      nextchar = arg + 1;
      if (optctrls & Options::LONG_ONLY) {
         return  parse_longopt(iter, optarg);
      } else {
         return  parse_opt(iter, optarg);
      }
   }

      // If we get here - it is because we have a list value
   OptionSpec  optspec = listopt;
   optarg = arg ;        // record the list value
   return  optspec.OptChar() ;
}